

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::internal::edit_distance::anon_unknown_1::Hunk::~Hunk(Hunk *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  p_Var2 = (this->hunk_removes_).
           super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->hunk_removes_) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x20);
    p_Var2 = p_Var1;
  }
  p_Var2 = (this->hunk_adds_).
           super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->hunk_adds_) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x20);
    p_Var2 = p_Var1;
  }
  p_Var2 = (this->hunk_).
           super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->hunk_) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x20);
    p_Var2 = p_Var1;
  }
  return;
}

Assistant:

Hunk(size_t left_start, size_t right_start)
      : left_start_(left_start),
        right_start_(right_start),
        adds_(),
        removes_(),
        common_() {}